

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles2::Functional::StencilCase::iterate(StencilCase *this)

{
  uint uVar1;
  uint stencilBits;
  int height;
  StencilCase *pSVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  char *description;
  int iVar10;
  long lVar11;
  int width;
  int iVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  float fVar19;
  vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  ops;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> cells;
  IVec4 viewport;
  Surface refFrame;
  Surface gles2Frame;
  Random rnd;
  ReferenceContextBuffers buffers;
  GLContext context;
  vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  local_63f0;
  StencilCase *local_63d8;
  float local_63cc;
  void *local_63c8;
  undefined8 uStack_63c0;
  long local_63b8;
  TestLog *local_63b0;
  int *local_63a8;
  IVec4 local_63a0;
  Surface local_6390;
  Surface local_6378;
  PixelBufferAccess local_6360;
  deRandom local_6338;
  ReferenceContextLimits local_6328;
  ReferenceContextBuffers local_62d0;
  MultisamplePixelBufferAccess local_6258;
  MultisamplePixelBufferAccess local_6230;
  MultisamplePixelBufferAccess local_6208;
  ReferenceContext local_61e0;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  local_63a8 = (int *)CONCAT44(extraout_var,iVar5);
  uVar1 = local_63a8[6];
  stencilBits = local_63a8[7];
  iVar5 = 1;
  if (stencilBits == 8) {
    iVar5 = 8;
  }
  uVar6 = 1 << ((byte)stencilBits & 0x1f);
  uVar7 = (int)uVar6 / iVar5;
  fVar19 = (float)(int)(uVar7 + 3);
  if (fVar19 < 0.0) {
    fVar19 = sqrtf(fVar19);
  }
  else {
    fVar19 = SQRT(fVar19);
  }
  local_63cc = ceilf(fVar19);
  piVar3 = local_63a8;
  width = *local_63a8;
  if (0x7f < width) {
    width = 0x80;
  }
  height = 0x80;
  if (local_63a8[1] < 0x80) {
    height = local_63a8[1];
  }
  local_63b0 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_63d8 = this;
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_6338,dVar8);
  iVar16 = *piVar3;
  dVar8 = deRandom_getUint32(&local_6338);
  iVar10 = piVar3[1];
  dVar9 = deRandom_getUint32(&local_6338);
  local_63a0.m_data[1] = dVar9 % ((iVar10 - height) + 1U);
  local_63a0.m_data[0] = dVar8 % ((iVar16 - width) + 1U);
  local_63a0.m_data[2] = width;
  local_63a0.m_data[3] = height;
  tcu::Surface::Surface(&local_6378,width,height);
  tcu::Surface::Surface(&local_6390,width,height);
  std::
  vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  ::vector(&local_63f0,(long)(int)(uVar7 + 3),(allocator_type *)&local_61e0);
  if (uVar7 < 0x7fffffff) {
    lVar11 = 0;
    iVar16 = 0;
    do {
      uVar14 = iVar16 << (stencilBits == 8) * '\x03';
      if ((int)(uVar6 - 1) <= (int)uVar14) {
        uVar14 = uVar6 - 1;
      }
      (*(local_63d8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (local_63d8,
                 (long)&((local_63f0.
                          super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar11,(ulong)stencilBits,
                 (ulong)uVar1,(ulong)uVar14);
      iVar16 = iVar16 + 1;
      lVar11 = lVar11 + 0x18;
    } while ((ulong)(uVar7 + 1) * 0x18 != lVar11);
  }
  pSVar2 = local_63d8;
  (*(local_63d8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (local_63d8,
             local_63f0.
             super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (int)(uVar7 + 1),(ulong)stencilBits,
             (ulong)uVar1,(ulong)uVar6);
  (*(pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (pSVar2,local_63f0.
                    super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (int)(uVar7 + 2),(ulong)stencilBits,
             (ulong)uVar1,0xffffffff);
  iVar16 = (int)local_63cc;
  local_63c8 = (void *)0x0;
  uStack_63c0 = 0;
  local_63b8 = 0;
  if (0 < iVar16) {
    iVar10 = 0;
    do {
      iVar12 = 0;
      iVar18 = iVar16;
      do {
        local_61e0.super_Context._vptr_Context =
             (_func_int **)CONCAT44(iVar10 * (height / iVar16),iVar12);
        local_61e0.super_Context.m_type.super_ApiType.m_bits = (ApiType)(ApiType)(width / iVar16);
        local_61e0.super_Context._12_4_ = height / iVar16;
        std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
        emplace_back<tcu::Vector<int,4>>
                  ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)&local_63c8,
                   (Vector<int,_4> *)&local_61e0);
        iVar12 = iVar12 + width / iVar16;
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar16);
  }
  pSVar2 = local_63d8;
  sglr::GLContext::GLContext
            ((GLContext *)&local_61e0,((local_63d8->super_TestCase).m_context)->m_renderCtx,
             local_63b0,0,&local_63a0);
  dVar8 = sglr::GLContext::createProgram
                    ((GLContext *)&local_61e0,&(pSVar2->m_shader).super_ShaderProgram);
  pSVar2->m_shaderID = dVar8;
  sglr::GLContext::clearColor((GLContext *)&local_61e0,1.0,0.0,0.0,1.0);
  sglr::GLContext::clear((GLContext *)&local_61e0,0x4500);
  if (0 < (int)((ulong)((long)local_63f0.
                              super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_63f0.
                             super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar15 = 0;
    lVar17 = 0;
    lVar11 = 0;
    do {
      executeOps(pSVar2,&local_61e0.super_Context,(IVec4 *)((long)local_63c8 + lVar15),
                 (vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                  *)((long)&((local_63f0.
                              super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar17));
      lVar11 = lVar11 + 1;
      lVar17 = lVar17 + 0x18;
      lVar15 = lVar15 + 0x10;
    } while (lVar11 < (int)((ulong)((long)local_63f0.
                                          super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_63f0.
                                         super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  visualizeStencil(pSVar2,&local_61e0.super_Context,stencilBits,iVar5);
  dVar8 = sglr::GLContext::getError((GLContext *)&local_61e0);
  sglr::Context::readPixels(&local_61e0.super_Context,&local_6378,0,0,width,height);
  sglr::GLContext::~GLContext((GLContext *)&local_61e0);
  local_61e0.super_Context._12_4_ = (uint)(local_63a8[5] != 0) << 3;
  local_61e0.super_Context._vptr_Context = (_func_int **)0x800000008;
  local_61e0.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&local_62d0,(PixelFormat *)&local_61e0,local_63a8[6],local_63a8[7],width,height,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits
            (&local_6328,((pSVar2->super_TestCase).m_context)->m_renderCtx);
  tcu::TextureLevel::getAccess(&local_6360,&local_62d0.m_colorbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_6360);
  tcu::TextureLevel::getAccess(&local_6360,&local_62d0.m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_6360);
  tcu::TextureLevel::getAccess(&local_6360,&local_62d0.m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_6360);
  sglr::ReferenceContext::ReferenceContext
            (&local_61e0,&local_6328,&local_6208,&local_6230,&local_6258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6328.extensionStr._M_dataplus._M_p != &local_6328.extensionStr.field_2) {
    operator_delete(local_6328.extensionStr._M_dataplus._M_p,
                    local_6328.extensionStr.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6328.extensionList);
  dVar9 = sglr::ReferenceContext::createProgram(&local_61e0,&(pSVar2->m_shader).super_ShaderProgram)
  ;
  pSVar2->m_shaderID = dVar9;
  sglr::ReferenceContext::clearColor(&local_61e0,1.0,0.0,0.0,1.0);
  sglr::ReferenceContext::clear(&local_61e0,0x4500);
  if (0 < (int)((ulong)((long)local_63f0.
                              super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_63f0.
                             super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar15 = 0;
    lVar11 = 0;
    lVar17 = 0;
    do {
      executeOps(pSVar2,&local_61e0.super_Context,(IVec4 *)((long)local_63c8 + lVar15),
                 (vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                  *)((long)&((local_63f0.
                              super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar11));
      lVar17 = lVar17 + 1;
      lVar11 = lVar11 + 0x18;
      lVar15 = lVar15 + 0x10;
    } while (lVar17 < (int)((ulong)((long)local_63f0.
                                          super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_63f0.
                                         super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  visualizeStencil(pSVar2,&local_61e0.super_Context,stencilBits,iVar5);
  sglr::Context::readPixels(&local_61e0.super_Context,&local_6390,0,0,width,height);
  sglr::ReferenceContext::~ReferenceContext(&local_61e0);
  tcu::TextureLevel::~TextureLevel(&local_62d0.m_stencilbuffer);
  tcu::TextureLevel::~TextureLevel(&local_62d0.m_depthbuffer);
  tcu::TextureLevel::~TextureLevel(&local_62d0.m_colorbuffer);
  bVar4 = tcu::fuzzyCompare(local_63b0,"ComparisonResult","Image comparison result",&local_6390,
                            &local_6378,0.02,COMPARE_LOG_RESULT);
  pcVar13 = "Image comparison failed";
  if (bVar4) {
    pcVar13 = "Pass";
  }
  description = "Got unexpected error";
  if (dVar8 == 0) {
    description = pcVar13;
  }
  tcu::TestContext::setTestResult
            ((pSVar2->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(dVar8 != 0 || !bVar4),description);
  if (local_63c8 != (void *)0x0) {
    operator_delete(local_63c8,local_63b8 - (long)local_63c8);
  }
  std::
  vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  ::~vector(&local_63f0);
  tcu::Surface::~Surface(&local_6390);
  tcu::Surface::~Surface(&local_6378);
  return STOP;
}

Assistant:

TestCase::IterateResult StencilCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	int							depthBits			= renderTarget.getDepthBits();
	int							stencilBits			= renderTarget.getStencilBits();

	int							stencilStep			= stencilBits == 8 ? 8 : 1;
	int							numStencilValues	= (1<<stencilBits)/stencilStep + 1;

	int							gridSize			= (int)deFloatCeil(deFloatSqrt((float)(numStencilValues+2)));

	int							width				= deMin32(128, renderTarget.getWidth());
	int							height				= deMin32(128, renderTarget.getHeight());

	tcu::TestLog&				log					= m_testCtx.getLog();
	de::Random					rnd					(deStringHash(m_name.c_str()));
	int							viewportX			= rnd.getInt(0, renderTarget.getWidth()-width);
	int							viewportY			= rnd.getInt(0, renderTarget.getHeight()-height);
	IVec4						viewport			= IVec4(viewportX, viewportY, width, height);

	tcu::Surface				gles2Frame			(width, height);
	tcu::Surface				refFrame			(width, height);
	GLenum						gles2Error;

	const char*					failReason			= DE_NULL;

	// Get ops for stencil values
	vector<vector<StencilOp> >	ops(numStencilValues+2);
	{
		// Values from 0 to max
		for (int ndx = 0; ndx < numStencilValues; ndx++)
			genOps(ops[ndx], stencilBits, depthBits, deMin32(ndx*stencilStep, (1<<stencilBits)-1));

		// -1 and max+1
		genOps(ops[numStencilValues+0], stencilBits, depthBits, 1<<stencilBits);
		genOps(ops[numStencilValues+1], stencilBits, depthBits, -1);
	}

	// Compute cells: (x, y, w, h)
	vector<IVec4>				cells;
	int							cellWidth			= width/gridSize;
	int							cellHeight			= height/gridSize;
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
		cells.push_back(IVec4(x*cellWidth, y*cellHeight, cellWidth, cellHeight));

	DE_ASSERT(ops.size() <= cells.size());

	// Execute for gles2 context
	{
		sglr::GLContext context(m_context.getRenderContext(), log, 0 /* don't log calls or program */, viewport);

		m_shaderID = context.createProgram(&m_shader);

		context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		for (int ndx = 0; ndx < (int)ops.size(); ndx++)
			executeOps(context, cells[ndx], ops[ndx]);

		visualizeStencil(context, stencilBits, stencilStep);

		gles2Error = context.getError();
		context.readPixels(gles2Frame, 0, 0, width, height);
	}

	// Execute for reference context
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(m_context.getRenderContext()), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		m_shaderID = context.createProgram(&m_shader);

		context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		for (int ndx = 0; ndx < (int)ops.size(); ndx++)
			executeOps(context, cells[ndx], ops[ndx]);

		visualizeStencil(context, stencilBits, stencilStep);

		context.readPixels(refFrame, 0, 0, width, height);
	}

	// Check error
	bool errorCodeOk = (gles2Error == GL_NO_ERROR);
	if (!errorCodeOk && !failReason)
		failReason = "Got unexpected error";

	// Compare images
	const float		threshold	= 0.02f;
	bool			imagesOk	= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, gles2Frame, threshold, tcu::COMPARE_LOG_RESULT);

	if (!imagesOk && !failReason)
		failReason = "Image comparison failed";

	// Store test result
	bool isOk = errorCodeOk && imagesOk;
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: failReason);

	return STOP;
}